

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_segment_id(AV1_COMP *cpi,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,aom_writer *w,
                     segmentation *seg,segmentation_probs *segp,int skip_txfm)

{
  aom_cdf_prob (*icdf) [9];
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  short sVar6;
  uint uVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint ref;
  ulong uVar13;
  uint8_t *puVar14;
  
  if ((seg->enabled != '\0') && (seg->update_map != '\0')) {
    iVar9 = 2 - (uint)(cpi->cyclic_refresh->skip_over4x4 == 0);
    iVar3 = xd->mi_row;
    iVar4 = xd->mi_col;
    puVar14 = ((cpi->common).cur_frame)->seg_map;
    uVar7 = 0xff;
    if ((xd->up_available == true) && (xd->left_available == true)) {
      uVar7 = 8;
      if (iVar3 - iVar9 < (cpi->common).mi_params.mi_rows) {
        iVar5 = (cpi->common).mi_params.mi_cols;
        if (iVar4 - iVar9 < iVar5) {
          bVar8 = 8;
          if (puVar14[iVar5 * (iVar3 - iVar9) + (iVar4 - iVar9)] < 8) {
            bVar8 = puVar14[iVar5 * (iVar3 - iVar9) + (iVar4 - iVar9)];
          }
          uVar7 = (uint)bVar8;
        }
      }
    }
    uVar10 = 0xff;
    if (xd->up_available != false) {
      uVar10 = 8;
      if ((iVar3 - iVar9 < (cpi->common).mi_params.mi_rows) &&
         (iVar5 = (cpi->common).mi_params.mi_cols, iVar4 < iVar5)) {
        uVar10 = 8;
        if (puVar14[iVar5 * (iVar3 - iVar9) + iVar4] < 8) {
          uVar10 = (uint)puVar14[iVar5 * (iVar3 - iVar9) + iVar4];
        }
      }
    }
    uVar12 = 0xff;
    if ((xd->left_available == true) && (uVar12 = 8, iVar3 < (cpi->common).mi_params.mi_rows)) {
      iVar5 = (cpi->common).mi_params.mi_cols;
      if (iVar4 - iVar9 < iVar5) {
        bVar8 = 8;
        if (puVar14[iVar5 * iVar3 + (iVar4 - iVar9)] < 8) {
          bVar8 = puVar14[iVar5 * iVar3 + (iVar4 - iVar9)];
        }
        uVar12 = (uint)bVar8;
      }
    }
    if (uVar7 == 0xff) {
      uVar13 = 0;
    }
    else if ((uVar7 != uVar10) || (uVar13 = 2, uVar7 != uVar12)) {
      uVar13 = (ulong)((uVar12 == uVar10 || uVar7 == uVar12) || uVar7 == uVar10);
    }
    if ((char)uVar10 == -1) {
      ref = 0;
      if (uVar12 != 0xff) {
        ref = uVar12;
      }
    }
    else {
      ref = uVar10;
      if ((uVar12 != 0xff) && (ref = uVar12, uVar7 == uVar10)) {
        ref = uVar10;
      }
    }
    if (skip_txfm == 0) {
      iVar9 = av1_neg_interleave(*(ushort *)&mbmi->field_0xa7 & 7,ref,seg->last_active_segid + 1);
      icdf = segp->spatial_pred_seg_cdf + uVar13;
      od_ec_encode_cdf_q15(&w->ec,iVar9,*icdf,8);
      if (w->allow_update_cdf != '\0') {
        uVar1 = (*icdf)[8];
        bVar8 = (char)(uVar1 >> 4) + 5;
        lVar11 = 0;
        do {
          uVar2 = (*icdf)[lVar11];
          if (lVar11 < (char)iVar9) {
            sVar6 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar8 & 0x1f));
          }
          else {
            sVar6 = -(uVar2 >> (bVar8 & 0x1f));
          }
          (*icdf)[lVar11] = sVar6 + uVar2;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 7);
        (*icdf)[8] = (*icdf)[8] + (ushort)(uVar1 < 0x20);
      }
      uVar7 = (cpi->common).mi_params.mi_rows - iVar3;
      if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [mbmi->bsize] <= (int)uVar7) {
        uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [mbmi->bsize];
      }
      if (0 < (int)uVar7) {
        bVar8 = mbmi->field_0xa7;
        iVar9 = (cpi->common).mi_params.mi_cols;
        puVar14 = ((cpi->common).cur_frame)->seg_map + (iVar3 * iVar9 + iVar4);
        uVar10 = iVar9 - iVar4;
        if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [mbmi->bsize] <= (int)uVar10) {
          uVar10 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [mbmi->bsize];
        }
        uVar13 = (ulong)uVar7;
        do {
          memset(puVar14,(uint)(bVar8 & 7),(long)(int)uVar10);
          puVar14 = puVar14 + iVar9;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
    }
    else {
      uVar7 = (cpi->common).mi_params.mi_rows - iVar3;
      if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [mbmi->bsize] <= (int)uVar7) {
        uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [mbmi->bsize];
      }
      if (0 < (int)uVar7) {
        iVar9 = (cpi->common).mi_params.mi_cols;
        puVar14 = ((cpi->common).cur_frame)->seg_map + (iVar9 * iVar3 + iVar4);
        uVar10 = iVar9 - iVar4;
        if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [mbmi->bsize] <= (int)uVar10) {
          uVar10 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [mbmi->bsize];
        }
        uVar13 = (ulong)uVar7;
        do {
          memset(puVar14,ref,(long)(int)uVar10);
          puVar14 = puVar14 + iVar9;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      uVar7 = (cpi->common).mi_params.mi_rows - iVar3;
      if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [mbmi->bsize] <= (int)uVar7) {
        uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [mbmi->bsize];
      }
      if (0 < (int)uVar7) {
        iVar9 = (cpi->common).mi_params.mi_cols;
        puVar14 = (cpi->enc_seg).map + (iVar3 * iVar9 + iVar4);
        uVar10 = iVar9 - iVar4;
        if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [mbmi->bsize] <= (int)uVar10) {
          uVar10 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [mbmi->bsize];
        }
        uVar13 = (ulong)uVar7;
        do {
          memset(puVar14,ref,(long)(int)uVar10);
          puVar14 = puVar14 + iVar9;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      *(ushort *)&mbmi->field_0xa7 = *(ushort *)&mbmi->field_0xa7 & 0xfff8 | (ushort)((byte)ref & 7)
      ;
    }
  }
  return;
}

Assistant:

static inline void write_segment_id(AV1_COMP *cpi, MACROBLOCKD *const xd,
                                    const MB_MODE_INFO *const mbmi,
                                    aom_writer *w,
                                    const struct segmentation *seg,
                                    struct segmentation_probs *segp,
                                    int skip_txfm) {
  if (!seg->enabled || !seg->update_map) return;

  AV1_COMMON *const cm = &cpi->common;
  int cdf_num;
  const uint8_t pred = av1_get_spatial_seg_pred(
      cm, xd, &cdf_num, cpi->cyclic_refresh->skip_over4x4);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  if (skip_txfm) {
    // Still need to transmit tx size for intra blocks even if skip_txfm is
    // true. Changing segment_id may make the tx size become invalid, e.g
    // changing from lossless to lossy.
    assert(is_inter_block(mbmi) || !cpi->enc_seg.has_lossless_segment);

    set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map, mbmi->bsize,
                           mi_row, mi_col, pred);
    set_spatial_segment_id(&cm->mi_params, cpi->enc_seg.map, mbmi->bsize,
                           mi_row, mi_col, pred);
    /* mbmi is read only but we need to update segment_id */
    ((MB_MODE_INFO *)mbmi)->segment_id = pred;
    return;
  }

  const int coded_id =
      av1_neg_interleave(mbmi->segment_id, pred, seg->last_active_segid + 1);
  aom_cdf_prob *pred_cdf = segp->spatial_pred_seg_cdf[cdf_num];
  aom_write_symbol(w, coded_id, pred_cdf, MAX_SEGMENTS);
  set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map, mbmi->bsize,
                         mi_row, mi_col, mbmi->segment_id);
}